

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
* __thiscall
burst::make_subset_iterator<std::initializer_list<int>&>
          (subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<int> *range)

{
  burst *this_00;
  int *first;
  int *last;
  initializer_list<int> *range_local;
  
  this_00 = (burst *)std::begin<int>(*(initializer_list<int> *)this);
  last = *(int **)this;
  first = std::end<int>(*(initializer_list<int> *)this);
  make_subset_iterator<int_const*>(__return_storage_ptr__,this_00,first,last);
  return __return_storage_ptr__;
}

Assistant:

auto make_subset_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subset_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }